

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZRefPatternTools.cpp
# Opt level: O0

TPZAutoPointer<TPZRefPattern>
TPZRefPatternTools::PerfectMatchRefPattern(TPZGeoEl *gel,TPZVec<int> *sidestorefine)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  TPZAutoPointer *this;
  int *piVar4;
  size_type sVar5;
  TPZRefPattern *pTVar6;
  reference pTVar7;
  TPZVec<int> *in_RDX;
  long in_RSI;
  TPZReference *in_RDI;
  iterator it2;
  TPZAutoPointer<TPZRefPattern> refpat;
  iterator it_1;
  int minsubel;
  int is;
  int nsides;
  int ncorners;
  TPZGeoEl *gelTemp;
  iterator it;
  list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_> perfectmatch;
  list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_> patlist;
  list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
  *in_stack_00000288;
  TPZGeoEl *in_stack_00000290;
  size_t in_stack_000002a8;
  char *in_stack_000002b0;
  TPZRefPattern *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  TPZRefPattern *in_stack_fffffffffffffe98;
  list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
  *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  TPZAutoPointer<TPZRefPattern> *in_stack_fffffffffffffeb0;
  TPZRefPattern *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  _Self local_d0;
  _Self local_c8;
  _List_node_base *local_c0;
  TPZAutoPointer<TPZRefPattern> local_b8;
  _Self local_b0;
  _Self local_a8;
  int local_a0;
  undefined4 local_9c;
  _List_node_base *local_98;
  _List_node_base *local_90;
  int local_84;
  int local_80;
  int local_7c;
  TPZGeoEl *local_78;
  _Self local_70;
  _List_node_base *local_68;
  _List_iterator<TPZAutoPointer<TPZRefPattern>_> local_60 [6];
  list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_> local_30;
  TPZVec<int> *local_18;
  
  if (in_RSI == 0) {
    TPZAutoPointer<TPZRefPattern>::TPZAutoPointer
              (in_stack_fffffffffffffeb0,
               (TPZRefPattern *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  else {
    local_18 = in_RDX;
    std::__cxx11::
    list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::list
              ((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                *)0x18f3d98);
    std::__cxx11::
    list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::list
              ((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                *)0x18f3da5);
    GetCompatibleRefPatterns(in_stack_00000290,in_stack_00000288);
    std::_List_iterator<TPZAutoPointer<TPZRefPattern>_>::_List_iterator(local_60);
    local_68 = (_List_node_base *)
               std::__cxx11::
               list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
               ::begin((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                        *)in_stack_fffffffffffffe88);
    local_60[0]._M_node = local_68;
    while( true ) {
      local_70._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::end
                     ((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                       *)in_stack_fffffffffffffe88);
      bVar1 = std::operator!=(local_60,&local_70);
      if (!bVar1) break;
      this = (TPZAutoPointer *)
             std::_List_iterator<TPZAutoPointer<TPZRefPattern>_>::operator*
                       ((_List_iterator<TPZAutoPointer<TPZRefPattern>_> *)0x18f3e2e);
      in_stack_ffffffffffffff07 = ::TPZAutoPointer::operator_cast_to_bool(this);
      if ((bool)in_stack_ffffffffffffff07) {
        pTVar7 = std::_List_iterator<TPZAutoPointer<TPZRefPattern>_>::operator*
                           ((_List_iterator<TPZAutoPointer<TPZRefPattern>_> *)0x18f3e71);
        in_stack_fffffffffffffef8 = TPZAutoPointer<TPZRefPattern>::operator->(pTVar7);
        local_78 = TPZRefPattern::Element
                             ((TPZRefPattern *)
                              CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                              (int)((ulong)in_stack_fffffffffffffe88 >> 0x20));
        local_7c = (**(code **)(*(long *)local_78 + 0x98))();
        local_80 = (**(code **)(*(long *)local_78 + 0xf0))();
        iVar3 = (**(code **)(*(long *)local_78 + 0x210))();
        if (iVar3 == 3) {
          local_80 = local_80 + -1;
        }
        for (local_84 = local_7c; local_84 < local_80; local_84 = local_84 + 1) {
          piVar4 = TPZVec<int>::operator[](local_18,(long)local_84);
          iVar3 = *piVar4;
          pTVar7 = std::_List_iterator<TPZAutoPointer<TPZRefPattern>_>::operator*
                             ((_List_iterator<TPZAutoPointer<TPZRefPattern>_> *)0x18f3f74);
          TPZAutoPointer<TPZRefPattern>::operator->(pTVar7);
          iVar2 = TPZRefPattern::NSideNodes
                            ((TPZRefPattern *)
                             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                             (int)((ulong)in_stack_fffffffffffffe88 >> 0x20));
          if (iVar3 != iVar2) break;
        }
        if (local_84 == local_80) {
          std::_List_iterator<TPZAutoPointer<TPZRefPattern>_>::operator*
                    ((_List_iterator<TPZAutoPointer<TPZRefPattern>_> *)0x18f3fdd);
          std::__cxx11::
          list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::
          push_back(in_stack_fffffffffffffea0,(value_type *)in_stack_fffffffffffffe98);
        }
      }
      local_90 = (_List_node_base *)
                 std::_List_iterator<TPZAutoPointer<TPZRefPattern>_>::operator++(local_60,0);
    }
    std::__cxx11::
    list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::clear
              ((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    sVar5 = std::__cxx11::
            list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::
            size((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    if (sVar5 == 1) {
      local_98 = (_List_node_base *)
                 std::__cxx11::
                 list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                 ::begin((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                          *)in_stack_fffffffffffffe88);
      std::_List_iterator<TPZAutoPointer<TPZRefPattern>_>::operator*
                ((_List_iterator<TPZAutoPointer<TPZRefPattern>_> *)0x18f4051);
      TPZAutoPointer<TPZRefPattern>::TPZAutoPointer
                ((TPZAutoPointer<TPZRefPattern> *)
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 (TPZAutoPointer<TPZRefPattern> *)in_stack_fffffffffffffe88);
    }
    else {
      sVar5 = std::__cxx11::
              list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::
              size((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      if (sVar5 < 2) {
        TPZAutoPointer<TPZRefPattern>::TPZAutoPointer
                  (in_stack_fffffffffffffeb0,
                   (TPZRefPattern *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      }
      else {
        local_a0 = 0x1e;
        local_a8._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::
             begin((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                    *)in_stack_fffffffffffffe88);
        while( true ) {
          local_b0._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
               ::end((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                      *)in_stack_fffffffffffffe88);
          bVar1 = std::operator!=(&local_a8,&local_b0);
          if (!bVar1) break;
          std::_List_iterator<TPZAutoPointer<TPZRefPattern>_>::operator*
                    ((_List_iterator<TPZAutoPointer<TPZRefPattern>_> *)0x18f40ea);
          TPZAutoPointer<TPZRefPattern>::TPZAutoPointer
                    ((TPZAutoPointer<TPZRefPattern> *)
                     CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                     (TPZAutoPointer<TPZRefPattern> *)in_stack_fffffffffffffe88);
          pTVar6 = TPZAutoPointer<TPZRefPattern>::operator->(&local_b8);
          iVar3 = TPZRefPattern::NSubElements(pTVar6);
          if (iVar3 < local_a0) {
            pTVar6 = TPZAutoPointer<TPZRefPattern>::operator->(&local_b8);
            local_a0 = TPZRefPattern::NSubElements(pTVar6);
            in_stack_fffffffffffffea0 = &local_30;
            std::__cxx11::
            list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::
            clear((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
            std::_List_iterator<TPZAutoPointer<TPZRefPattern>_>::operator*
                      ((_List_iterator<TPZAutoPointer<TPZRefPattern>_> *)0x18f417f);
            std::__cxx11::
            list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::
            push_back(in_stack_fffffffffffffea0,(value_type *)in_stack_fffffffffffffe98);
          }
          else {
            in_stack_fffffffffffffe98 = TPZAutoPointer<TPZRefPattern>::operator->(&local_b8);
            in_stack_fffffffffffffe94 = TPZRefPattern::NSubElements(in_stack_fffffffffffffe98);
            if (in_stack_fffffffffffffe94 == local_a0) {
              std::_List_iterator<TPZAutoPointer<TPZRefPattern>_>::operator*
                        ((_List_iterator<TPZAutoPointer<TPZRefPattern>_> *)0x18f41f4);
              std::__cxx11::
              list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::
              push_back(in_stack_fffffffffffffea0,(value_type *)in_stack_fffffffffffffe98);
            }
          }
          TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                    ((TPZAutoPointer<TPZRefPattern> *)
                     CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
          local_c0 = (_List_node_base *)
                     std::_List_iterator<TPZAutoPointer<TPZRefPattern>_>::operator++(&local_a8,0);
        }
        sVar5 = std::__cxx11::
                list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                ::size((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
        if (sVar5 != 1) {
          local_c8._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
               ::begin((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                        *)in_stack_fffffffffffffe88);
          while( true ) {
            local_d0._M_node =
                 (_List_node_base *)
                 std::__cxx11::
                 list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                 ::end((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                        *)in_stack_fffffffffffffe88);
            bVar1 = std::operator!=(&local_c8,&local_d0);
            if (!bVar1) break;
            pTVar7 = std::_List_iterator<TPZAutoPointer<TPZRefPattern>_>::operator*
                               ((_List_iterator<TPZAutoPointer<TPZRefPattern>_> *)0x18f429c);
            in_stack_fffffffffffffe88 = TPZAutoPointer<TPZRefPattern>::operator->(pTVar7);
            TPZGeoMesh::Print((TPZGeoMesh *)
                              CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                              (ostream *)in_stack_fffffffffffffef8);
            std::_List_iterator<TPZAutoPointer<TPZRefPattern>_>::operator++(&local_c8,0);
          }
          pzinternal::DebugStopImpl(in_stack_000002b0,in_stack_000002a8);
        }
        std::__cxx11::
        list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::begin
                  ((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                    *)in_stack_fffffffffffffe88);
        std::_List_iterator<TPZAutoPointer<TPZRefPattern>_>::operator*
                  ((_List_iterator<TPZAutoPointer<TPZRefPattern>_> *)0x18f4315);
        TPZAutoPointer<TPZRefPattern>::TPZAutoPointer
                  ((TPZAutoPointer<TPZRefPattern> *)
                   CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   (TPZAutoPointer<TPZRefPattern> *)in_stack_fffffffffffffe88);
      }
    }
    local_9c = 1;
    std::__cxx11::
    list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::~list
              ((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                *)0x18f435f);
    std::__cxx11::
    list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::~list
              ((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                *)0x18f436c);
  }
  return (TPZAutoPointer<TPZRefPattern>)in_RDI;
}

Assistant:

TPZAutoPointer<TPZRefPattern> TPZRefPatternTools::PerfectMatchRefPattern(TPZGeoEl *gel,
                                                                         TPZVec<int> &sidestorefine)
{
	if(!gel)
	{
		return NULL;
	}
	
	std::list<TPZAutoPointer<TPZRefPattern> > patlist, perfectmatch;
	TPZRefPatternTools::GetCompatibleRefPatterns(gel, patlist);
	
    // totototo
    //std::cout << "gel index " << gel->Index() << " sides " <<  sidestorefine << std::endl;
	std::list<TPZAutoPointer<TPZRefPattern> >::iterator it;
	for(it = patlist.begin(); it != patlist.end(); it++)
	{
		if( !(*it) )
		{
			continue;	
		}
		TPZGeoEl * gelTemp = (*it)->Element(0);
		int ncorners = gelTemp->NCornerNodes();
		int nsides = gelTemp->NSides();
		if(gelTemp->Dimension() == 3)
		{
			nsides--;
		}

		int is;
		for(is = ncorners; is < nsides; is++)
		{
			if( sidestorefine[is] != (*it)->NSideNodes(is) )
			{
				break;	
			}
		}
		if(is == nsides)
		{
            perfectmatch.push_back(*it);
		}
	}
    //std::cout << "perfect match size " << perfectmatch.size() << std::endl;
    
    patlist.clear();
    if (perfectmatch.size() == 1) {
        return *perfectmatch.begin();
    } else if(perfectmatch.size() > 1)
    {
        // return the refpattern with the least number of elements
        
        int minsubel = 30;
        for (auto it=perfectmatch.begin(); it!= perfectmatch.end(); it++) {
            TPZAutoPointer<TPZRefPattern> refpat = *it;
            if (refpat->NSubElements() < minsubel) {
                minsubel = refpat->NSubElements();
                patlist.clear();
                patlist.push_back(*it);
            }
            else if(refpat->NSubElements() == minsubel)
            {
                patlist.push_back(*it);
            }
        }
        if (patlist.size() != 1) {
            for (auto it2=patlist.begin(); it2 != patlist.end(); it2++) {
                (*it2)->fRefPatternMesh.Print();
            }
            DebugStop();
        }
        return *patlist.begin();
    }
    else
    {
        return NULL;
    }
}